

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testutil.h
# Opt level: O3

void testutil_random_fe_test(secp256k1_fe *x)

{
  uchar bin [32];
  uchar auStack_48 [32];
  
  while( true ) {
    testrand_bytes_test(auStack_48,0x20);
    secp256k1_fe_impl_set_b32_mod(x,auStack_48);
    if (x->n[0] < 0xffffefffffc2f) {
      return;
    }
    if (x->n[4] != 0xffffffffffff) break;
    if ((x->n[2] & x->n[3] & x->n[1]) != 0xfffffffffffff) {
      return;
    }
  }
  return;
}

Assistant:

static void testutil_random_fe_test(secp256k1_fe *x) {
    unsigned char bin[32];
    do {
        testrand256_test(bin);
        if (secp256k1_fe_set_b32_limit(x, bin)) {
            return;
        }
    } while(1);
}